

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O1

unique_ptr<MCTS::Node<GoState<3U,_3U>_>,_std::default_delete<MCTS::Node<GoState<3U,_3U>_>_>_>
MCTS::compute_tree<GoState<3u,3u>>
          (GoState<3U,_3U> *root_state,ComputeOptions options,result_type initial_seed)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  result_type rVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  _func_int **pp_Var8;
  Node<GoState<3U,_3U>_> *this;
  runtime_error *this_00;
  long lVar9;
  ulong in_RDX;
  int iVar10;
  double dVar11;
  GoState<3U,_3U> state;
  mt19937_64 random_engine;
  Move local_a64;
  result_type local_a60;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_a58;
  uchar (*local_a50) [3];
  GoState<3U,_3U> local_a48;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9f8;
  
  lVar9 = 1;
  do {
    in_RDX = (in_RDX >> 0x3e ^ in_RDX) * 0x5851f42d4c957f2d + lVar9;
    local_9f8._M_x[lVar9] = in_RDX;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x138);
  local_9f8._M_p = 0x138;
  if ((options.max_iterations < 0) && (options.max_time < 0.0)) {
    assertion_failed("options.max_iterations >= 0 || options.max_time >= 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x135);
  }
  if (0.0 <= options.max_time) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"ComputeOptions::max_time requires OpenMP.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (1 < *(int *)(initial_seed + 0x4c) - 1U) {
    assertion_failed("root_state.player_to_move == 1 || root_state.player_to_move == 2",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x13c);
  }
  pp_Var8 = (_func_int **)operator_new(0x60);
  *(undefined4 *)pp_Var8 = 0xfffffffe;
  pp_Var8[1] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var8 + 2) = *(undefined4 *)(initial_seed + 0x4c);
  pp_Var8[3] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var8 + 4) = 0;
  (**(code **)(*(long *)initial_seed + 0x60))(pp_Var8 + 5,initial_seed);
  pp_Var8[10] = (_func_int *)0x0;
  pp_Var8[0xb] = (_func_int *)0x0;
  pp_Var8[8] = (_func_int *)0x0;
  pp_Var8[9] = (_func_int *)0x0;
  root_state->_vptr_GoState = pp_Var8;
  GoState<3U,_3U>::GoState(&local_a48);
  if (options.max_iterations != 0) {
    local_a50 = (uchar (*) [3])(initial_seed + 8);
    local_a58 = (_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)(initial_seed + 0x18);
    iVar10 = 1;
    local_a60 = initial_seed;
    do {
      rVar4 = local_a60;
      this = (Node<GoState<3U,_3U>_> *)root_state->_vptr_GoState;
      local_a48.board._0_8_ = *(undefined8 *)local_a50;
      local_a48._16_8_ = *(undefined8 *)(local_a50[2] + 2);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::operator=(&local_a48.all_hash_values._M_t,local_a58);
      local_a48._72_8_ = *(undefined8 *)(rVar4 + 0x48);
      while( true ) {
        piVar2 = (this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (piVar2 != piVar3) break;
        if ((this->children).
            super__Vector_base<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->children).
            super__Vector_base<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (piVar2 == piVar3) goto LAB_00146638;
          break;
        }
        this = Node<GoState<3U,_3U>_>::select_child_UCT(this);
        GoState<3U,_3U>::do_move(&local_a48,this->move);
      }
      local_a64 = Node<GoState<3u,3u>>::
                  get_untried_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                            ((Node<GoState<3u,3u>> *)this,&local_9f8);
      GoState<3U,_3U>::do_move(&local_a48,local_a64);
      this = Node<GoState<3U,_3U>_>::add_child(this,&local_a64,&local_a48);
LAB_00146638:
      while( true ) {
        bVar5 = GoState<3U,_3U>::has_moves(&local_a48);
        if (!bVar5) break;
        GoState<3u,3u>::
        do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                  ((GoState<3u,3u> *)&local_a48,&local_9f8);
      }
      for (; this != (Node<GoState<3U,_3U>_> *)0x0; this = this->parent) {
        iVar1 = this->player_to_move;
        iVar6 = (*local_a48._vptr_GoState[0xd])(&local_a48,1);
        iVar7 = (*local_a48._vptr_GoState[0xd])(&local_a48,2);
        dVar11 = 0.5;
        if ((iVar6 != iVar7) && (dVar11 = 0.0, (iVar6 <= iVar7) + 1 != iVar1)) {
          dVar11 = 1.0;
        }
        this->visits = this->visits + 1;
        this->wins = dVar11 + this->wins;
      }
      bVar5 = iVar10 != options.max_iterations;
      iVar10 = iVar10 + 1;
    } while (bVar5);
  }
  local_a48._vptr_GoState = (_func_int **)&PTR__GoState_00162878;
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_a48.all_hash_values._M_t);
  return (__uniq_ptr_data<MCTS::Node<GoState<3U,_3U>_>,_std::default_delete<MCTS::Node<GoState<3U,_3U>_>_>,_true,_true>
          )(__uniq_ptr_data<MCTS::Node<GoState<3U,_3U>_>,_std::default_delete<MCTS::Node<GoState<3U,_3U>_>_>,_true,_true>
            )root_state;
}

Assistant:

std::unique_ptr<Node<State>>  compute_tree(const State root_state,
                                           const ComputeOptions options,
                                           std::mt19937_64::result_type initial_seed)
{
	std::mt19937_64 random_engine(initial_seed);

	attest(options.max_iterations >= 0 || options.max_time >= 0);
	if (options.max_time >= 0) {
		#ifndef USE_OPENMP
		throw std::runtime_error("ComputeOptions::max_time requires OpenMP.");
		#endif
	}
	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);
	auto root = std::unique_ptr<Node<State>>(new Node<State>(root_state));

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	double print_time = start_time;
	#endif

	State state;
	for (int iter = 1; iter <= options.max_iterations || options.max_iterations < 0; ++iter) {
		auto node = root.get();
		state = root_state;

		// Select a path through the tree to a leaf node.
		while (!node->has_untried_moves() && node->has_children()) {
			node = node->select_child_UCT();
			state.do_move(node->move);
		}

		// If we are not already at the final state, expand the
		// tree with a new node and move there.
		if (node->has_untried_moves()) {
			auto move = node->get_untried_move(&random_engine);
			state.do_move(move);
			node = node->add_child(move, state);
		}

		// We now play randomly until the game ends.
		while (state.has_moves()) {
			state.do_random_move(&random_engine);
		}

		// We have now reached a final state. Backpropagate the result
		// up the tree to the root node.
		while (node != nullptr) {
			node->update(state.get_result(node->player_to_move));
			node = node->parent;
		}

		#ifdef USE_OPENMP
		if (options.verbose || options.max_time >= 0) {
			double time = ::omp_get_wtime();
			if (options.verbose && (time - print_time >= 1.0 || iter == options.max_iterations)) {
				std::cerr << iter << " games played (" << double(iter) / (time - start_time) << " / second)." << endl;
				print_time = time;
			}

			if (time - start_time >= options.max_time) {
				break;
			}
		}
		#endif
	}

	return root;
}